

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.c
# Opt level: O0

mat4_t * mat4_ortho4(mat4_t *__return_storage_ptr__,float left,float right,float bottom,float top,
                    float near,float far)

{
  float r23;
  float r13;
  float r03;
  float r22;
  float r11;
  float r00;
  float depth;
  float height;
  float width;
  float far_local;
  float near_local;
  float top_local;
  float bottom_local;
  float right_local;
  float left_local;
  
  mat4(__return_storage_ptr__,2.0 / (right - left),0.0,0.0,0.0,0.0,2.0 / (top - bottom),0.0,0.0,0.0,
       0.0,-2.0 / (far - near),0.0,-(right + left) / (right - left),-(top + bottom) / (top - bottom)
       ,-(far + near) / (far - near),1.0);
  return __return_storage_ptr__;
}

Assistant:

mat4_t
mat4_ortho4(float left, float right, float bottom, float top, float near, float far) {
    float	width	= right - left;
    float	height	= top - bottom;
    float	depth	= far - near;
    float	r00	= 2.0f / width;
    float	r11	= 2.0f / height;
    float	r22	= -2.0f / depth;
    float	r03	= -(right + left) / width;
    float	r13	= -(top + bottom) / height;
    float	r23	= -(far + near) / depth;
    return mat4(r00, 0.0f, 0.0f, 0.0f,
            0.0f, r11, 0.0f, 0.0f,
            0.0f, 0.0f, r22, 0.0f,
            r03, r13, r23, 1.0f);
}